

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixFullPathname(sqlite3_vfs *pVfs,char *zPath,int nOut,char *zOut)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int local_e4;
  undefined1 local_e0 [4];
  int n;
  stat buf;
  char *pcStack_48;
  int bLink;
  char *zDel;
  char *zIn;
  int local_30;
  int nLink;
  int nByte;
  int rc;
  char *zOut_local;
  int nOut_local;
  char *zPath_local;
  sqlite3_vfs *pVfs_local;
  
  nLink = 0;
  zIn._4_4_ = 1;
  pcStack_48 = (char *)0x0;
  zDel = zPath;
  do {
    buf.__glibc_reserved[2]._4_4_ = 0;
    iVar1 = (*aSyscall[0x1b].pCurrent)(zDel,local_e0);
    if (iVar1 == 0) {
      buf.__glibc_reserved[2]._4_4_ = (uint)(((uint)buf.st_nlink & 0xf000) == 0xa000);
    }
    else {
      piVar2 = __errno_location();
      if (*piVar2 != 2) {
        iVar1 = sqlite3CantopenError(0x97a3);
        nLink = unixLogErrorAtLine(iVar1,"lstat",zDel,0x97a3);
      }
    }
    if (buf.__glibc_reserved[2]._4_4_ != 0) {
      if (pcStack_48 == (char *)0x0) {
        pcStack_48 = (char *)sqlite3_malloc(nOut);
        if (pcStack_48 == (char *)0x0) {
          nLink = 7;
        }
      }
      else {
        zIn._4_4_ = zIn._4_4_ + 1;
        if (100 < zIn._4_4_) {
          nLink = sqlite3CantopenError(0x97ae);
        }
      }
      if (nLink == 0) {
        local_30 = (*aSyscall[0x1a].pCurrent)(zDel,pcStack_48,(long)(nOut + -1));
        if (local_30 < 0) {
          iVar1 = sqlite3CantopenError(0x97b4);
          nLink = unixLogErrorAtLine(iVar1,"readlink",zDel,0x97b4);
        }
        else {
          if (*pcStack_48 != '/') {
            local_e4 = sqlite3Strlen30(zDel);
            while( true ) {
              bVar3 = false;
              if (0 < local_e4) {
                bVar3 = zDel[local_e4 + -1] != '/';
              }
              if (!bVar3) break;
              local_e4 = local_e4 + -1;
            }
            if (nOut < local_30 + local_e4 + 1) {
              nLink = sqlite3CantopenError(0x97ba);
            }
            else {
              memmove(pcStack_48 + local_e4,pcStack_48,(long)(local_30 + 1));
              memcpy(pcStack_48,zDel,(long)local_e4);
              local_30 = local_e4 + local_30;
            }
          }
          pcStack_48[local_30] = '\0';
        }
      }
      zDel = pcStack_48;
    }
    if ((nLink == 0) && (zDel != zOut)) {
      nLink = mkFullPathname(zDel,zOut,nOut);
    }
  } while ((buf.__glibc_reserved[2]._4_4_ != 0) && (zDel = zOut, nLink == 0));
  sqlite3_free(pcStack_48);
  return nLink;
}

Assistant:

static int unixFullPathname(
  sqlite3_vfs *pVfs,            /* Pointer to vfs object */
  const char *zPath,            /* Possibly relative input path */
  int nOut,                     /* Size of output buffer in bytes */
  char *zOut                    /* Output buffer */
){
#if !defined(HAVE_READLINK) || !defined(HAVE_LSTAT)
  return mkFullPathname(zPath, zOut, nOut);
#else
  int rc = SQLITE_OK;
  int nByte;
  int nLink = 1;                /* Number of symbolic links followed so far */
  const char *zIn = zPath;      /* Input path for each iteration of loop */
  char *zDel = 0;

  assert( pVfs->mxPathname==MAX_PATHNAME );
  UNUSED_PARAMETER(pVfs);

  /* It's odd to simulate an io-error here, but really this is just
  ** using the io-error infrastructure to test that SQLite handles this
  ** function failing. This function could fail if, for example, the
  ** current working directory has been unlinked.
  */
  SimulateIOError( return SQLITE_ERROR );

  do {

    /* Call stat() on path zIn. Set bLink to true if the path is a symbolic
    ** link, or false otherwise.  */
    int bLink = 0;
    struct stat buf;
    if( osLstat(zIn, &buf)!=0 ){
      if( errno!=ENOENT ){
        rc = unixLogError(SQLITE_CANTOPEN_BKPT, "lstat", zIn);
      }
    }else{
      bLink = S_ISLNK(buf.st_mode);
    }

    if( bLink ){
      if( zDel==0 ){
        zDel = sqlite3_malloc(nOut);
        if( zDel==0 ) rc = SQLITE_NOMEM_BKPT;
      }else if( ++nLink>SQLITE_MAX_SYMLINKS ){
        rc = SQLITE_CANTOPEN_BKPT;
      }

      if( rc==SQLITE_OK ){
        nByte = osReadlink(zIn, zDel, nOut-1);
        if( nByte<0 ){
          rc = unixLogError(SQLITE_CANTOPEN_BKPT, "readlink", zIn);
        }else{
          if( zDel[0]!='/' ){
            int n;
            for(n = sqlite3Strlen30(zIn); n>0 && zIn[n-1]!='/'; n--);
            if( nByte+n+1>nOut ){
              rc = SQLITE_CANTOPEN_BKPT;
            }else{
              memmove(&zDel[n], zDel, nByte+1);
              memcpy(zDel, zIn, n);
              nByte += n;
            }
          }
          zDel[nByte] = '\0';
        }
      }

      zIn = zDel;
    }

    assert( rc!=SQLITE_OK || zIn!=zOut || zIn[0]=='/' );
    if( rc==SQLITE_OK && zIn!=zOut ){
      rc = mkFullPathname(zIn, zOut, nOut);
    }
    if( bLink==0 ) break;
    zIn = zOut;
  }while( rc==SQLITE_OK );

  sqlite3_free(zDel);
  return rc;
#endif   /* HAVE_READLINK && HAVE_LSTAT */
}